

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *p,int iNode)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  int *piVar1;
  int iVar2;
  word wVar3;
  word *pwVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  piVar1 = (p->vRefs).pArray;
  wVar3 = Gia_Rsb2ManOdcs(p,iNode);
  p->CareSet = wVar3;
  if ((iNode < 0) || ((p->vSims).nSize <= iNode * 2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  uVar5 = (p->vSims).pArray[(uint)(iNode * 2)] & wVar3;
  p->Truth1 = uVar5;
  p->Truth0 = uVar5 ^ wVar3;
  p_00 = &p->vpDivs;
  (p->vpDivs).nSize = 0;
  Vec_PtrPush(p_00,&p->Truth0);
  Vec_PtrPush(p_00,&p->Truth1);
  p_01 = &p->vDivs;
  (p->vDivs).nSize = 0;
  Vec_IntPushTwo(p_01,-1,-1);
  iVar7 = 2;
  for (iVar6 = 1; iVar6 <= p->nPis; iVar6 = iVar6 + 1) {
    pwVar4 = Vec_WrdEntryP(&p->vSims,iVar7);
    Vec_PtrPush(p_00,pwVar4);
    Vec_IntPush(p_01,iVar6);
    iVar7 = iVar7 + 2;
  }
  iVar6 = Gia_Rsb2ManMffc(p,iNode);
  p->nMffc = iVar6;
  if (p->nLevelIncrease < 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = Gia_Rsb2ManLevel(p);
    p->Level = iVar6;
    iVar6 = Vec_IntEntry(&p->vLevels,iNode);
  }
  lVar8 = (long)p->nPis;
  iVar7 = p->nPis * 2;
  while( true ) {
    iVar7 = iVar7 + 2;
    lVar8 = lVar8 + 1;
    if (p->iFirstPo <= lVar8) break;
    if ((piVar1[lVar8] != 0) &&
       ((p->nLevelIncrease < 0 ||
        (iVar2 = Vec_IntEntry(&p->vLevels,(int)lVar8), iVar2 <= p->nLevelIncrease + iVar6)))) {
      pwVar4 = Vec_WrdEntryP(&p->vSims,iVar7);
      Vec_PtrPush(p_00,pwVar4);
      Vec_IntPush(p_01,(int)lVar8);
    }
  }
  iVar6 = (p->vDivs).nSize;
  if (iVar6 != (p->vpDivs).nSize) {
    __assert_fail("Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x11e,"int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *, int)");
  }
  return iVar6;
}

Assistant:

int Gia_Rsb2ManDivs( Gia_Rsb2Man_t * p, int iNode )
{
    int i, iNodeLevel = 0;
    int * pRefs = Vec_IntArray( &p->vRefs );
    p->CareSet = Gia_Rsb2ManOdcs( p, iNode );
    p->Truth1 = p->CareSet & Vec_WrdEntry(&p->vSims, 2*iNode);
    p->Truth0 = p->CareSet & ~p->Truth1;
    Vec_PtrClear( &p->vpDivs );
    Vec_PtrPush( &p->vpDivs, &p->Truth0 );
    Vec_PtrPush( &p->vpDivs, &p->Truth1 );
    Vec_IntClear( &p->vDivs );
    Vec_IntPushTwo( &p->vDivs, -1, -1 );
    for ( i = 1; i <= p->nPis; i++ )
    {
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    p->nMffc = Gia_Rsb2ManMffc( p, iNode );
    if ( p->nLevelIncrease >= 0 )
    {
        p->Level = Gia_Rsb2ManLevel(p);
        iNodeLevel = Vec_IntEntry(&p->vLevels, iNode);
    }
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
    {
        if ( !pRefs[i] || (p->nLevelIncrease >= 0 && Vec_IntEntry(&p->vLevels, i) > iNodeLevel + p->nLevelIncrease) )
            continue;
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    assert( Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs) );
    return Vec_IntSize(&p->vDivs);
}